

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.h
# Opt level: O0

void __thiscall cmCMakePresetsGraph::Preset::Preset(Preset *this,Preset *param_1)

{
  undefined7 uVar1;
  Preset *param_1_local;
  Preset *this_local;
  
  this->_vptr_Preset = (_func_int **)&PTR__Preset_011c30d0;
  std::__cxx11::string::string((string *)&this->Name,(string *)&param_1->Name);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Inherits,&param_1->Inherits);
  uVar1 = *(undefined7 *)&param_1->field_0x41;
  this->Hidden = param_1->Hidden;
  *(undefined7 *)&this->field_0x41 = uVar1;
  this->OriginFile = param_1->OriginFile;
  std::__cxx11::string::string((string *)&this->DisplayName,(string *)&param_1->DisplayName);
  std::__cxx11::string::string((string *)&this->Description,(string *)&param_1->Description);
  std::shared_ptr<cmCMakePresetsGraph::Condition>::shared_ptr
            (&this->ConditionEvaluator,&param_1->ConditionEvaluator);
  this->ConditionResult = (bool)(param_1->ConditionResult & 1);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::map(&this->Environment,&param_1->Environment);
  return;
}

Assistant:

Preset(Preset&& /*other*/) = default;